

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFDocEncoding.cpp
# Opt level: O0

BoolAndByte __thiscall PDFDocEncoding::Encode(PDFDocEncoding *this,unsigned_long inUnicodeCharacter)

{
  bool bVar1;
  int local_28;
  bool local_21;
  unsigned_long local_20;
  unsigned_long inUnicodeCharacter_local;
  PDFDocEncoding *this_local;
  BoolAndByte result;
  
  local_21 = true;
  local_28 = 0;
  local_20 = inUnicodeCharacter;
  inUnicodeCharacter_local = (unsigned_long)this;
  std::pair<bool,_unsigned_char>::pair<bool,_int,_true>
            ((pair<bool,_unsigned_char> *)((long)&this_local + 6),&local_21,&local_28);
  bVar1 = betweenIncluding<unsigned_long>(local_20,0,0x17);
  if (((bVar1) || (bVar1 = betweenIncluding<unsigned_long>(local_20,0x20,0x7e), bVar1)) ||
     (bVar1 = betweenIncluding<unsigned_long>(local_20,0xa1,0xff), bVar1)) {
    this_local._6_2_ = (BoolAndByte)CONCAT11((uchar)local_20,this_local._6_1_);
  }
  else if (local_20 == 0x131) {
    this_local._6_2_ = (BoolAndByte)CONCAT11(0x9a,this_local._6_1_);
  }
  else if (local_20 == 0x141) {
    this_local._6_2_ = (BoolAndByte)CONCAT11(0x95,this_local._6_1_);
  }
  else if (local_20 == 0x142) {
    this_local._6_2_ = (BoolAndByte)CONCAT11(0x9b,this_local._6_1_);
  }
  else if (local_20 == 0x152) {
    this_local._6_2_ = (BoolAndByte)CONCAT11(0x96,this_local._6_1_);
  }
  else if (local_20 == 0x153) {
    this_local._6_2_ = (BoolAndByte)CONCAT11(0x9c,this_local._6_1_);
  }
  else if (local_20 == 0x160) {
    this_local._6_2_ = (BoolAndByte)CONCAT11(0x97,this_local._6_1_);
  }
  else if (local_20 == 0x161) {
    this_local._6_2_ = (BoolAndByte)CONCAT11(0x9d,this_local._6_1_);
  }
  else if (local_20 == 0x178) {
    this_local._6_2_ = (BoolAndByte)CONCAT11(0x98,this_local._6_1_);
  }
  else if (local_20 == 0x17d) {
    this_local._6_2_ = (BoolAndByte)CONCAT11(0x99,this_local._6_1_);
  }
  else if (local_20 == 0x17e) {
    this_local._6_2_ = (BoolAndByte)CONCAT11(0x9e,this_local._6_1_);
  }
  else if (local_20 == 0x192) {
    this_local._6_2_ = (BoolAndByte)CONCAT11(0x86,this_local._6_1_);
  }
  else if (local_20 == 0x2c6) {
    this_local._6_2_ = (BoolAndByte)CONCAT11('\x1a',this_local._6_1_);
  }
  else if (local_20 == 0x2c7) {
    this_local._6_2_ = (BoolAndByte)CONCAT11('\x19',this_local._6_1_);
  }
  else if (local_20 == 0x2d8) {
    this_local._6_2_ = (BoolAndByte)CONCAT11('\x18',this_local._6_1_);
  }
  else if (local_20 == 0x2d9) {
    this_local._6_2_ = (BoolAndByte)CONCAT11('\x1b',this_local._6_1_);
  }
  else if (local_20 == 0x2da) {
    this_local._6_2_ = (BoolAndByte)CONCAT11('\x1e',this_local._6_1_);
  }
  else if (local_20 == 0x2db) {
    this_local._6_2_ = (BoolAndByte)CONCAT11('\x1d',this_local._6_1_);
  }
  else if (local_20 == 0x2dc) {
    this_local._6_2_ = (BoolAndByte)CONCAT11('\x1f',this_local._6_1_);
  }
  else if (local_20 == 0x2dd) {
    this_local._6_2_ = (BoolAndByte)CONCAT11('\x1c',this_local._6_1_);
  }
  else if (local_20 == 0x2013) {
    this_local._6_2_ = (BoolAndByte)CONCAT11(0x85,this_local._6_1_);
  }
  else if (local_20 == 0x2014) {
    this_local._6_2_ = (BoolAndByte)CONCAT11(0x84,this_local._6_1_);
  }
  else if (local_20 == 0x2018) {
    this_local._6_2_ = (BoolAndByte)CONCAT11(0x8f,this_local._6_1_);
  }
  else if (local_20 == 0x2019) {
    this_local._6_2_ = (BoolAndByte)CONCAT11(0x90,this_local._6_1_);
  }
  else if (local_20 == 0x201a) {
    this_local._6_2_ = (BoolAndByte)CONCAT11(0x91,this_local._6_1_);
  }
  else if (local_20 == 0x201c) {
    this_local._6_2_ = (BoolAndByte)CONCAT11(0x8d,this_local._6_1_);
  }
  else if (local_20 == 0x201d) {
    this_local._6_2_ = (BoolAndByte)CONCAT11(0x8e,this_local._6_1_);
  }
  else if (local_20 == 0x201e) {
    this_local._6_2_ = (BoolAndByte)CONCAT11(0x8c,this_local._6_1_);
  }
  else if (local_20 == 0x2020) {
    this_local._6_2_ = (BoolAndByte)CONCAT11(0x81,this_local._6_1_);
  }
  else if (local_20 == 0x2021) {
    this_local._6_2_ = (BoolAndByte)CONCAT11(0x82,this_local._6_1_);
  }
  else if (local_20 == 0x2022) {
    this_local._6_2_ = (BoolAndByte)CONCAT11(0x80,this_local._6_1_);
  }
  else if (local_20 == 0x2026) {
    this_local._6_2_ = (BoolAndByte)CONCAT11(0x83,this_local._6_1_);
  }
  else if (local_20 == 0x2030) {
    this_local._6_2_ = (BoolAndByte)CONCAT11(0x8b,this_local._6_1_);
  }
  else if (local_20 == 0x2039) {
    this_local._6_2_ = (BoolAndByte)CONCAT11(0x88,this_local._6_1_);
  }
  else if (local_20 == 0x203a) {
    this_local._6_2_ = (BoolAndByte)CONCAT11(0x89,this_local._6_1_);
  }
  else if (local_20 == 0x2044) {
    this_local._6_2_ = (BoolAndByte)CONCAT11(0x87,this_local._6_1_);
  }
  else if (local_20 == 0x20ac) {
    this_local._6_2_ = (BoolAndByte)CONCAT11(0xa0,this_local._6_1_);
  }
  else if (local_20 == 0x2122) {
    this_local._6_2_ = (BoolAndByte)CONCAT11(0x92,this_local._6_1_);
  }
  else if (local_20 == 0x2212) {
    this_local._6_2_ = (BoolAndByte)CONCAT11(0x8a,this_local._6_1_);
  }
  else if (local_20 == 0xfb01) {
    this_local._6_2_ = (BoolAndByte)CONCAT11(0x93,this_local._6_1_);
  }
  else if (local_20 == 0xfb02) {
    this_local._6_2_ = (BoolAndByte)CONCAT11(0x94,this_local._6_1_);
  }
  else {
    this_local._6_2_ = (BoolAndByte)((ushort)this_local._6_2_ & 0xff00);
  }
  return this_local._6_2_;
}

Assistant:

BoolAndByte PDFDocEncoding::Encode(unsigned long inUnicodeCharacter)
{
	BoolAndByte result(true,0);

	if(	betweenIncluding<unsigned long>(inUnicodeCharacter,0x00,0x17) ||
		betweenIncluding<unsigned long>(inUnicodeCharacter,0x20,0x7E) ||
		betweenIncluding<unsigned long>(inUnicodeCharacter,0xA1,0xFF))
	{
		result.second = (char)inUnicodeCharacter;
	}
	else 
	{
		switch(inUnicodeCharacter)
		{
			case 0x02D8:
				result.second = 0x18;
				break;
			case 0x02C7:
				result.second = 0x19;
				break;
			case 0x02C6:
				result.second = 0x1a;
				break;
			case 0x02D9:
				result.second = 0x1b;
				break;
			case 0x02DD:
				result.second = 0x1c;
				break;
			case 0x02DB:
				result.second = 0x1d;
				break;
			case 0x02DA:
				result.second = 0x1e;
				break;
			case 0x02DC:
				result.second = 0x1f;
				break;
			case 0x2022:
				result.second = 0x80;
				break;
			case 0x2020:
				result.second = 0x81;
				break;
			case 0x2021:
				result.second = 0x82;
				break;
			case 0x2026:
				result.second = 0x83;
				break;
			case 0x2014:
				result.second = 0x84;
				break;
			case 0x2013:
				result.second = 0x85;
				break;
			case 0x192:
				result.second = 0x86;
				break;
			case 0x2044:
				result.second = 0x87;
				break;
			case 0x2039:
				result.second = 0x88;
				break;
			case 0x203A:
				result.second = 0x89;
				break;
			case 0x2212:
				result.second = 0x8a;
				break;
			case 0x2030:
				result.second = 0x8b;
				break;
			case 0x201E:
				result.second = 0x8c;
				break;
			case 0x201C:
				result.second = 0x8d;
				break;
			case 0x201D:
				result.second = 0x8e;
				break;
			case 0x2018:
				result.second = 0x8f;
				break;
			case 0x2019:
				result.second = 0x90;
				break;
			case 0x201A:
				result.second = 0x91;
				break;
			case 0x2122:
				result.second = 0x92;
				break;
			case 0xFB01:
				result.second = 0x93;
				break;
			case 0xFB02:
				result.second = 0x94;
				break;
			case 0x141:
				result.second = 0x95;
				break;
			case 0x152:
				result.second = 0x96;
				break;
			case 0x160:
				result.second = 0x97;
				break;
			case 0x178:
				result.second = 0x98;
				break;
			case 0x17D:
				result.second = 0x99;
				break;
			case 0x131:
				result.second = 0x9a;
				break;
			case 0x142:
				result.second = 0x9b;
				break;
			case 0x153:
				result.second = 0x9c;
				break;
			case 0x161:
				result.second = 0x9d;
				break;
			case 0x17E:
				result.second = 0x9e;
				break;
			case 0x20AC:
				result.second = 0xa0;
				break;
			default:
				result.first = false;
		}
	}
	return result;
}